

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_layer_t.h
# Opt level: O0

void __thiscall pool_layer_t::activate(pool_layer_t *this)

{
  point_t out;
  ulong uVar1;
  float *pfVar2;
  pool_layer_t *in_RDI;
  float v;
  int j;
  int i;
  float mval;
  point_t mapped;
  int z;
  int y;
  int x;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  int local_5c;
  int local_58;
  float local_54;
  int local_14;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < (in_RDI->super_layer_t).out.size.x; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < (in_RDI->super_layer_t).out.size.y; local_10 = local_10 + 1) {
      for (local_14 = 0; local_14 < (in_RDI->super_layer_t).out.size.z; local_14 = local_14 + 1) {
        uVar1 = CONCAT44(local_10,local_c) & 0xffff0000ffff;
        out.z = 0;
        out.x = (int)uVar1;
        out.y = (int)(uVar1 >> 0x20);
        map_to_input(in_RDI,out,0);
        local_54 = -3.4028235e+38;
        for (local_58 = 0; local_58 < (int)(uint)in_RDI->extend_filter; local_58 = local_58 + 1) {
          for (local_5c = 0; local_5c < (int)(uint)in_RDI->extend_filter; local_5c = local_5c + 1) {
            pfVar2 = tensor_t<float>::operator()
                               ((tensor_t<float> *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0);
            if (local_54 < *pfVar2) {
              local_54 = *pfVar2;
            }
          }
        }
        pfVar2 = tensor_t<float>::operator()
                           ((tensor_t<float> *)CONCAT44(local_54,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0);
        *pfVar2 = local_54;
        in_stack_ffffffffffffff94 = local_54;
      }
    }
  }
  return;
}

Assistant:

void activate() {
    for (int x = 0; x < out.size.x; x++) {
      for (int y = 0; y < out.size.y; y++) {
        for (int z = 0; z < out.size.z; z++) {
          point_t mapped = map_to_input({(uint16_t) x, (uint16_t) y, 0}, 0);
          float mval = -FLT_MAX;
          for (int i = 0; i < extend_filter; i++)
            for (int j = 0; j < extend_filter; j++) {
              float v = in(mapped.x + i, mapped.y + j, z);
              if (v > mval)
                mval = v;
            }
          out(x, y, z) = mval;
        }
      }
    }
  }